

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptFunctionCall
          (HlslGrammar *this,TSourceLoc *loc,TString *name,TIntermTyped **node,
          TIntermTyped *baseObject)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  TString *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  TFunction *this_01;
  TIntermTyped *pTVar4;
  TString *s;
  TIntermTyped *arguments;
  
  s = (TString *)loc;
  if (baseObject != (TIntermTyped *)0x0) {
    bVar1 = HlslParseContext::isBuiltInMethod(this->parseContext,loc,baseObject,name);
    if (bVar1) {
      this_00 = NewPoolTString_abi_cxx11_("__BI_");
    }
    else {
      iVar3 = (*(baseObject->super_TIntermNode)._vptr_TIntermNode[0x1e])(baseObject);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x128))
                        ((long *)CONCAT44(extraout_var,iVar3));
      if (cVar2 == '\0') {
        expected(this,"structure");
        return false;
      }
      this_00 = NewPoolTString_abi_cxx11_("");
      iVar3 = (*(baseObject->super_TIntermNode)._vptr_TIntermNode[0x1e])(baseObject);
      __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x28))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,__str);
      HlslParseContext::addScopeMangler(this->parseContext,this_00);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,name);
    s = name;
    name = this_00;
  }
  this_01 = (TFunction *)TSymbol::operator_new((TSymbol *)0x160,(size_t)s);
  TType::TType((TType *)&arguments,EbtVoid,EvqTemporary,1,0,0,false);
  TFunction::TFunction(this_01,name,(TType *)&arguments,EOpNull);
  arguments = (TIntermTyped *)0x0;
  if (baseObject != (TIntermTyped *)0x0) {
    HlslParseContext::handleFunctionArgument(this->parseContext,this_01,&arguments,baseObject);
  }
  bVar1 = acceptArguments(this,this_01,&arguments);
  if (!bVar1) {
    return false;
  }
  pTVar4 = HlslParseContext::handleFunctionCall(this->parseContext,loc,this_01,arguments);
  *node = pTVar4;
  return pTVar4 != (TIntermTyped *)0x0;
}

Assistant:

bool HlslGrammar::acceptFunctionCall(const TSourceLoc& loc, TString& name, TIntermTyped*& node, TIntermTyped* baseObject)
{
    // name
    TString* functionName = nullptr;
    if (baseObject == nullptr) {
        functionName = &name;
    } else if (parseContext.isBuiltInMethod(loc, baseObject, name)) {
        // Built-in methods are not in the symbol table as methods, but as global functions
        // taking an explicit 'this' as the first argument.
        functionName = NewPoolTString(BUILTIN_PREFIX);
        functionName->append(name);
    } else {
        if (! baseObject->getType().isStruct()) {
            expected("structure");
            return false;
        }
        functionName = NewPoolTString("");
        functionName->append(baseObject->getType().getTypeName());
        parseContext.addScopeMangler(*functionName);
        functionName->append(name);
    }

    // function
    TFunction* function = new TFunction(functionName, TType(EbtVoid));

    // arguments
    TIntermTyped* arguments = nullptr;
    if (baseObject != nullptr) {
        // Non-static member functions have an implicit first argument of the base object.
        parseContext.handleFunctionArgument(function, arguments, baseObject);
    }
    if (! acceptArguments(function, arguments))
        return false;

    // call
    node = parseContext.handleFunctionCall(loc, function, arguments);

    return node != nullptr;
}